

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_options.cpp
# Opt level: O3

int __thiscall Clasp::Cli::ClaspCliConfig::getValue(ClaspCliConfig *this,KeyType key,string *out)

{
  float fVar1;
  byte bVar2;
  Integration IVar3;
  Policy PVar4;
  ClaspCliConfig *pCVar5;
  ulong uVar6;
  UserConfig *pUVar7;
  undefined4 uVar9;
  uint *puVar8;
  undefined4 uVar10;
  undefined4 uVar11;
  int iVar12;
  undefined4 extraout_var;
  RestartSchedule *num;
  ulong uVar14;
  StringRef *pSVar15;
  uint uVar16;
  long lVar17;
  uint *y;
  Set<Clasp::SolverParams::Forget> *num_00;
  char **in_R8;
  ClaspCliConfig *pCVar18;
  Set<Clasp::HeuParams::DomMod> mod;
  StringRef str;
  Set<Clasp::HeuParams::DomPref> pick;
  undefined8 local_68;
  string local_60;
  Set<Clasp::HeuParams::DomPref> local_3c;
  CCMinType local_38;
  Type local_34;
  ulong *puVar13;
  undefined4 extraout_var_00;
  
  pCVar5 = (ClaspCliConfig *)(this->super_ClaspConfig).tester_;
  pCVar18 = pCVar5;
  if ((key >> 0x19 & 1) == 0) {
    pCVar18 = this;
  }
  if (pCVar18 == (ClaspCliConfig *)0x0 || 0x48 < (ushort)key) {
    return -1;
  }
  uVar16 = (key & 0x7f) - 1;
  if (0x47 < uVar16) {
    if ((ushort)key == 0) {
      bVar2 = (pCVar18->super_ClaspConfig).super_BasicSatConfig.super_ContextParams.cliConfig;
      if (bVar2 < 0x14) {
        lVar17 = 0;
        do {
          if (*(uint *)(enumMap(Clasp::Cli::ConfigKey_const*)::map + lVar17 + 8) == (uint)bVar2)
          break;
          lVar17 = lVar17 + 0x10;
        } while (lVar17 != 0x80);
        std::__cxx11::string::append((char *)out);
      }
      else {
        std::__cxx11::string::_M_append
                  ((char *)out,(ulong)this->config_[pCVar18 == pCVar5]._M_dataplus._M_p);
      }
    }
    goto LAB_00122dbd;
  }
  if ((pCVar18 != this) && ((0x35 < uVar16 || (0xfffffffc < (key & 0x7f) - 7)))) {
    Potassco::fail(-1,"int Clasp::Cli::ClaspCliConfig::getValue(KeyType, std::string &) const",0x3a8
                   ,"base == this || isTesterOption(o)",(char *)0x0);
  }
  uVar14 = (ulong)(key >> 0x10) & 0xff;
  iVar12 = (*(pCVar18->super_ClaspConfig).super_BasicSatConfig.super_UserConfiguration.
             super_Configuration._vptr_Configuration[6])(pCVar18,uVar14);
  puVar13 = (ulong *)CONCAT44(extraout_var,iVar12);
  iVar12 = (*(pCVar18->super_ClaspConfig).super_BasicSatConfig.super_UserConfiguration.
             super_Configuration._vptr_Configuration[7])(pCVar18,uVar14);
  num = (RestartSchedule *)CONCAT44(extraout_var_00,iVar12);
  uVar11 = local_68._4_4_;
  switch(key & 0xffff) {
  case 1:
    local_68 = (char *)(CONCAT44(uVar11,(uint)(byte)(pCVar18->super_ClaspConfig).
                                                    super_BasicSatConfig.super_ContextParams.
                                                    field_0x8) & 0xffffffff00000007);
    Potassco::string_cast<Clasp::ContextParams::ShareMode>(&local_60,(ShareMode *)&local_68);
    break;
  case 2:
    local_68 = (char *)(CONCAT71(local_68._1_7_,
                                 (byte)(pCVar18->super_ClaspConfig).super_BasicSatConfig.
                                       super_ContextParams.field_0x8 >> 5) & 0xffffffffffffff01);
    Potassco::string_cast<unsigned_char>(&local_60,(uchar *)&local_68);
    break;
  case 3:
    Potassco::string_cast<Clasp::SatPreParams>
              (&local_60,
               &(pCVar18->super_ClaspConfig).super_BasicSatConfig.super_ContextParams.satPre);
    break;
  case 4:
    pUVar7 = (this->super_ClaspConfig).tester_;
    if ((pUVar7 == (UserConfig *)0x0) || (((pUVar7->super_ContextParams).field_0x8 & 0x18) == 0)) {
      local_68 = (char *)(CONCAT71(local_68._1_7_,
                                   (byte)(this->super_ClaspConfig).super_BasicSatConfig.
                                         super_ContextParams.field_0x8 >> 3) & 0xffffffffffffff03);
      local_60._M_dataplus._M_p = (pointer)out;
      Potassco::operator<<((StringRef *)&local_60,(uchar *)&local_68);
    }
    else {
      local_3c.val = CONCAT31(local_3c.val._1_3_,
                              (byte)(this->super_ClaspConfig).super_BasicSatConfig.
                                    super_ContextParams.field_0x8 >> 3) & 0xffffff03;
      local_60._M_dataplus._M_p = (pointer)out;
      pSVar15 = Potassco::operator<<((StringRef *)&local_60,(uchar *)&local_3c);
      local_38 = CONCAT31(local_38._1_3_,
                          (byte)(((this->super_ClaspConfig).tester_)->super_ContextParams).field_0x8
                          >> 3) & 0xffffff03;
      Potassco::operator<<(pSVar15,(uchar *)&local_38);
    }
    goto LAB_00122dbd;
  case 5:
    local_68 = (char *)CONCAT71(local_68._1_7_,((this->super_ClaspConfig).parse.set & 0x3f) != 0);
    Potassco::string_cast<bool>(&local_60,(bool *)&local_68);
    break;
  case 6:
    local_68 = (char *)CONCAT71(local_68._1_7_,(this->super_ClaspConfig).parse.set >> 7);
    Potassco::string_cast<bool>(&local_60,(bool *)&local_68);
    break;
  case 7:
    Potassco::string_cast<Clasp::OptParams>(&local_60,(OptParams *)(puVar13 + 2));
    break;
  case 8:
    uVar16 = (uint)puVar13[2];
    if ((uVar16 & 0xe0) == 0) {
      Potassco::string_cast<Potassco::OffType>(&local_60,(OffType *)&Potassco::off);
    }
    else {
      local_68 = (char *)(CONCAT44(uVar11,uVar16 >> 5) & 0xffffffff00000007);
      local_3c.val = uVar16 >> 0xc & 0x1f;
      Potassco::toString<Clasp::OptParams::UscTrim,unsigned_int>
                (&local_60,(Potassco *)&local_68,&local_3c.val,(uint *)(ulong)(uVar16 >> 5 & 7));
    }
    break;
  case 9:
    local_68 = (char *)(CONCAT44(uVar11,(uint)puVar13[2] >> 1) & 0xffffffff00000003);
    Potassco::string_cast<Potassco::Set<Clasp::OptParams::Heuristic>>
              (&local_60,(Potassco *)&local_68,(Set<Clasp::OptParams::Heuristic> *)num_00);
    break;
  case 10:
    local_68 = (char *)(CONCAT44(uVar11,(uint)(*puVar13 >> 0x34)) & 0xffffffff00000001);
    Potassco::string_cast<unsigned_int>(&local_60,(uint *)&local_68);
    break;
  case 0xb:
    uVar16 = (uint)puVar13[3];
    if ((uVar16 & 0x30000) == 0) {
      Potassco::string_cast<Potassco::OffType>(&local_60,(OffType *)&Potassco::off);
    }
    else {
      local_68 = (char *)(CONCAT44(uVar11,uVar16 >> 0x10) & 0xffffffff00000003);
      local_3c.val = uVar16 & 0xffff;
      Potassco::toString<Clasp::Var_t::Type,unsigned_int>
                (&local_60,(Potassco *)&local_68,&local_3c.val,(uint *)(ulong)(uVar16 >> 0x10 & 3));
    }
    break;
  case 0xc:
    local_68 = (char *)(CONCAT44(uVar11,*(undefined4 *)((long)puVar13 + 4)) & 0xffffffff00000007);
    local_3c.val = (uint)(ushort)puVar13[1];
    Potassco::toString<Clasp::Heuristic_t::Type,unsigned_int>
              (&local_60,(Potassco *)&local_68,&local_3c.val,&switchD_00121fd2::switchdataD_001a3328
              );
    break;
  case 0xd:
    local_68 = (char *)(CONCAT44(uVar11,(uint)puVar13[1] >> 0x14) & 0xffffffff00000001);
    Potassco::string_cast<unsigned_int>(&local_60,(uint *)&local_68);
    break;
  case 0xe:
    local_68 = (char *)(CONCAT44(uVar11,(uint)*(ushort *)((long)puVar13 + 10)) & 0xffffffff00000003)
    ;
    Potassco::string_cast<Clasp::HeuParams::Score>(&local_60,(Score *)&local_68);
    break;
  case 0xf:
    local_68 = (char *)(CONCAT44(uVar11,(uint)puVar13[1] >> 0x12) & 0xffffffff00000003);
    Potassco::string_cast<Clasp::HeuParams::ScoreOther>(&local_60,(ScoreOther *)&local_68);
    break;
  case 0x10:
    local_68 = (char *)(CONCAT44(uVar11,(uint)(*puVar13 >> 0x35)) & 0xffffffff00000003);
    Potassco::string_cast<Clasp::SolverStrategies::SignHeu>(&local_60,(SignHeu *)&local_68);
    break;
  case 0x11:
    local_68 = (char *)(CONCAT44(uVar11,(uint)(*puVar13 >> 0x37)) & 0xffffffff00000001);
    Potassco::string_cast<unsigned_int>(&local_60,(uint *)&local_68);
    break;
  case 0x12:
    local_68 = (char *)(CONCAT44(uVar11,(uint)puVar13[1] >> 0x16) & 0xffffffff00000001);
    Potassco::string_cast<unsigned_int>(&local_60,(uint *)&local_68);
    break;
  case 0x13:
    local_68 = (char *)(CONCAT44(uVar11,(uint)puVar13[1] >> 0x17) & 0xffffffff00000001);
    Potassco::string_cast<unsigned_int>(&local_60,(uint *)&local_68);
    break;
  case 0x14:
    uVar16 = *(uint *)((long)puVar13 + 0xc);
    if ((uVar16 & 0x3ff) == 0) {
      Potassco::string_cast<Potassco::OffType>(&local_60,(OffType *)&Potassco::off);
    }
    else {
      local_68 = (char *)(CONCAT44(uVar11,uVar16) & 0xffffffff000003ff);
      local_3c.val = uVar16 >> 10 & 0x7f;
      local_38 = uVar16 >> 0x11;
      Potassco::toString<unsigned_int,unsigned_int,unsigned_int>
                (&local_60,(Potassco *)&local_68,&local_3c.val,&local_38,(uint *)in_R8);
    }
    break;
  case 0x15:
    local_68 = (char *)(CONCAT44(uVar11,(uint)puVar13[1] >> 0x15) & 0xffffffff00000001);
    Potassco::string_cast<unsigned_int>(&local_60,(uint *)&local_68);
    break;
  case 0x16:
    uVar16 = (uint)puVar13[1];
    local_68 = (char *)CONCAT44(uVar11,uVar16 >> 0x1d);
    local_3c.val = uVar16 >> 0x18 & 0x1f;
    if (local_3c.val == 0 || uVar16 < 0x20000000) {
      local_60._M_dataplus._M_p = (pointer)out;
      Potassco::operator<<((StringRef *)&local_60,(Set<Clasp::HeuParams::DomMod> *)&local_68);
    }
    else {
      local_60._M_dataplus._M_p = (pointer)out;
      pSVar15 = Potassco::operator<<
                          ((StringRef *)&local_60,(Set<Clasp::HeuParams::DomMod> *)&local_68);
      Potassco::operator<<(pSVar15,&local_3c);
    }
    goto LAB_00122dbd;
  case 0x17:
    local_68 = (char *)CONCAT44(uVar11,(uint)*(ushort *)((long)puVar13 + 2));
    Potassco::string_cast<unsigned_int>(&local_60,(uint *)&local_68);
    break;
  case 0x18:
    local_68 = (char *)(CONCAT44(uVar11,(uint)(*puVar13 >> 0x2f)) & 0xffffffff00000003);
    Potassco::string_cast<Clasp::SolverStrategies::WatchInit>(&local_60,(WatchInit *)&local_68);
    break;
  case 0x19:
    local_68 = (char *)(CONCAT44(uVar11,(uint)(*puVar13 >> 0x31)) & 0xffffffff00000001);
    Potassco::string_cast<Clasp::SolverStrategies::UpdateMode>(&local_60,(UpdateMode *)&local_68);
    break;
  case 0x1a:
    local_68 = (char *)CONCAT44(uVar11,(uint)(((uint)puVar13[3] >> 0x14 & 1) == 0));
    Potassco::string_cast<unsigned_int>(&local_60,(uint *)&local_68);
    break;
  case 0x1b:
    Potassco::string_cast<unsigned_int>(&local_60,(uint *)((long)puVar13 + 0x14));
    break;
  case 0x1c:
    local_68 = (char *)(CONCAT71(local_68._1_7_,(char)(*puVar13 >> 0x33)) & 0xffffffffffffff01);
    Potassco::string_cast<bool>(&local_60,(bool *)&local_68);
    break;
  case 0x1d:
    local_68 = (char *)(CONCAT44(uVar11,(uint)puVar13[3] >> 0x15) & 0xffffffff0000000f);
    Potassco::string_cast<Potassco::Set<Clasp::SolverParams::Forget>>
              (&local_60,(Potassco *)&local_68,num_00);
    break;
  case 0x1e:
    uVar14 = *puVar13;
    if ((~uVar14 & 0x60000000000) == 0) {
      Potassco::string_cast<Potassco::OffType>(&local_60,(OffType *)&Potassco::off);
    }
    else {
      uVar16 = (uint)(uVar14 >> 0x20);
      local_3c.val = uVar16 >> 0xd & 1;
      local_38 = uVar16 >> 9 & 3;
      local_68 = "no";
      if ((uVar14 >> 0x2e & 1) == 0) {
        local_68 = "yes";
      }
      Potassco::
      toString<Clasp::SolverStrategies::CCMinType,Clasp::SolverStrategies::CCMinAntes,char_const*>
                (&local_60,(Potassco *)&local_3c,&local_38,(CCMinAntes *)&local_68,in_R8);
    }
    break;
  case 0x1f:
    local_68 = (char *)(CONCAT44(uVar11,(uint)(*puVar13 >> 0x25)) & 0xffffffff00000003);
    Potassco::string_cast<unsigned_int>(&local_60,(uint *)&local_68);
    break;
  case 0x20:
    if ((*puVar13 & 0x18000000000) == 0) {
      Potassco::string_cast<Potassco::OffType>(&local_60,(OffType *)&Potassco::off);
    }
    else {
      local_68 = (char *)(CONCAT44(uVar11,(uint)(*puVar13 >> 0x27)) & 0xffffffff00000003);
      local_3c.val = *(uint *)&num[4].super_ScheduleStrategy & 0x7f;
      Potassco::toString<Clasp::SolverStrategies::LbdMode,unsigned_int>
                (&local_60,(Potassco *)&local_68,&local_3c.val,(uint *)0x18000000000);
    }
    break;
  case 0x21:
    local_68 = (char *)(CONCAT44(uVar11,(uint)(*puVar13 >> 0x32)) & 0xffffffff00000001);
    Potassco::string_cast<unsigned_int>(&local_60,(uint *)&local_68);
    break;
  case 0x22:
    local_68 = (char *)(CONCAT44(uVar11,(uint)(*puVar13 >> 0x23)) & 0xffffffff00000003);
    Potassco::string_cast<unsigned_int>(&local_60,(uint *)&local_68);
    break;
  case 0x23:
    uVar14 = *puVar13;
    if ((short)uVar14 == 0) {
      Potassco::string_cast<Potassco::OffType>(&local_60,(OffType *)&Potassco::off);
    }
    else {
      local_68 = (char *)CONCAT44(uVar11,(int)(CCRepMode *)(uVar14 & 0xffff));
      local_3c.val = (uint)(uVar14 >> 0x2b) & 3;
      Potassco::toString<unsigned_int,Clasp::SolverStrategies::CCRepMode>
                (&local_60,(Potassco *)&local_68,&local_3c.val,(CCRepMode *)(uVar14 & 0xffff));
    }
    break;
  case 0x24:
    local_68 = (char *)(CONCAT44(uVar11,(uint)puVar13[3] >> 0x12) & 0xffffffff00000003);
    Potassco::string_cast<Clasp::DefaultUnfoundedCheck::ReasonStrategy>
              (&local_60,(ReasonStrategy *)&local_68);
    break;
  case 0x25:
    uVar16 = num[6].super_ScheduleStrategy.len;
    if ((uVar16 & 0x7f000000) == 0) {
      Potassco::string_cast<Potassco::OffType>(&local_60,(OffType *)&Potassco::off);
    }
    else {
      local_68 = (char *)(CONCAT44(uVar11,uVar16 >> 0x18) & 0xffffffff0000007f);
      local_3c.val = uVar16 & 0xffffff;
      Potassco::toString<unsigned_int,unsigned_int>
                (&local_60,(Potassco *)&local_68,&local_3c.val,
                 (uint *)(ulong)(uVar16 >> 0x18 & 0x7f));
    }
    break;
  case 0x26:
    local_68 = (char *)(CONCAT44(uVar11,(uint)*(byte *)&num[6].super_ScheduleStrategy.grow) &
                       0xffffffff00000003);
    Potassco::string_cast<Clasp::SolverStrategies::SignHeu>(&local_60,(SignHeu *)&local_68);
    break;
  case 0x27:
    Potassco::string_cast<float>(&local_60,(float *)&num[6].super_ScheduleStrategy.idx);
    break;
  case 0x28:
    uVar16 = *(uint *)&num[6].super_ScheduleStrategy;
    if ((uVar16 & 0xffff) == 0) {
      Potassco::string_cast<Potassco::OffType>(&local_60,(OffType *)&Potassco::off);
    }
    else {
      local_68 = (char *)(CONCAT44(uVar11,uVar16) & 0xffffffff0000ffff);
      local_3c.val = uVar16 >> 0x10;
      Potassco::toString<unsigned_int,unsigned_int>
                (&local_60,(Potassco *)&local_68,&local_3c.val,(uint *)(ulong)(uVar16 & 0xffff));
    }
    break;
  case 0x29:
    Potassco::string_cast<Clasp::RestartSchedule>(&local_60,num);
    break;
  case 0x2a:
    uVar9 = num[1].super_ScheduleStrategy.grow;
    local_68 = (char *)(CONCAT44(uVar11,(uint)uVar9 >> 0x1c) & 0xffffffff00000003);
    Potassco::string_cast<Clasp::RestartParams::SeqUpdate>(&local_60,(SeqUpdate *)&local_68);
    break;
  case 0x2b:
    uVar10 = num[1].super_ScheduleStrategy.grow;
    local_68 = (char *)(CONCAT44(uVar11,(uint)uVar10 >> 0x1e) & 0xffffffff00000001);
    Potassco::string_cast<unsigned_int>(&local_60,(uint *)&local_68);
    break;
  case 0x2c:
    uVar6._0_4_ = num[1].super_ScheduleStrategy.len;
    uVar6._4_4_ = num[1].super_ScheduleStrategy.grow;
    if ((short)(undefined4)uVar6 == 0) {
      Potassco::string_cast<Potassco::OffType>(&local_60,(OffType *)&Potassco::off);
    }
    else {
      local_68 = (char *)CONCAT44(uVar11,(int)(uint *)(uVar6 & 0xffff));
      local_3c.val = (uint)(uVar6 >> 0x10) & 0xffff;
      Potassco::toString<unsigned_int,unsigned_int>
                (&local_60,(Potassco *)&local_68,&local_3c.val,(uint *)(uVar6 & 0xffff));
    }
    break;
  case 0x2d:
    if ((*(ulong *)&num[1].super_ScheduleStrategy & 0x7fffff) == 0) {
      local_60._M_dataplus._M_p = (pointer)out;
      Potassco::operator<<((StringRef *)&local_60,(OffType *)&Potassco::off);
    }
    else {
      local_68 = (char *)(CONCAT44(uVar11,(int)*(ulong *)&num[1].super_ScheduleStrategy) &
                         0xffffffff007fffff);
      local_60._M_dataplus._M_p = (pointer)out;
      pSVar15 = Potassco::operator<<((StringRef *)&local_60,(uint *)&local_68);
      local_3c.val = (uint)((float)(*(uint *)&num[1].super_ScheduleStrategy >> 0x17) / 100.0);
      pSVar15 = Potassco::operator<<(pSVar15,(float *)&local_3c);
      local_38 = num[1].super_ScheduleStrategy.idx & 0x1fffffff;
      pSVar15 = Potassco::operator<<(pSVar15,&local_38);
      local_34 = (Type)((ulong)*(undefined8 *)&num[1].super_ScheduleStrategy >> 0x3d);
      Potassco::operator<<(pSVar15,&local_34);
    }
    goto LAB_00122dbd;
  case 0x2e:
    uVar14._0_4_ = num[1].super_ScheduleStrategy.len;
    uVar14._4_4_ = num[1].super_ScheduleStrategy.grow;
    if ((uVar14 & 0x3fff00000000) == 0) {
      Potassco::string_cast<Potassco::OffType>(&local_60,(OffType *)&Potassco::off);
    }
    else {
      local_68 = (char *)(CONCAT44(uVar11,uVar14._4_4_) & 0xffffffff00003fff);
      local_3c.val = (uint)uVar14._4_4_ >> 0xe & 0x3fff;
      Potassco::toString<unsigned_int,unsigned_int>
                (&local_60,(Potassco *)&local_68,&local_3c.val,
                 (uint *)(ulong)(uVar14._4_4_ & 0x3fff));
    }
    break;
  case 0x2f:
    uVar16 = *(uint *)&num[4].super_ScheduleStrategy;
    if ((uVar16 & 0x3f800) == 0) {
      Potassco::string_cast<Potassco::OffType>(&local_60,(OffType *)&Potassco::off);
    }
    else {
      local_68 = (char *)(CONCAT44(uVar11,uVar16 >> 0x1b) & 0xffffffff00000003);
      local_3c.val = uVar16 >> 0xb & 0x7f;
      local_38 = uVar16 >> 0x19 & 3;
      Potassco::toString<Clasp::ReduceStrategy::Algorithm,unsigned_int,Clasp::ReduceStrategy::Score>
                (&local_60,(Potassco *)&local_68,&local_3c.val,&local_38,(Score *)in_R8);
    }
    break;
  case 0x30:
    fVar1 = num[4].super_ScheduleStrategy.grow;
    if ((fVar1 != 0.0) || (NAN(fVar1))) {
      local_60._M_dataplus._M_p = (pointer)out;
      pSVar15 = Potassco::operator<<((StringRef *)&local_60,&num[4].super_ScheduleStrategy.grow);
      Potassco::operator<<(pSVar15,(float *)&num[4].super_ScheduleStrategy.len);
      if (((undefined1  [16])num[3].super_ScheduleStrategy & (undefined1  [16])0x3fffffff) !=
          (undefined1  [16])0x0) {
        Potassco::operator<<((StringRef *)&local_60,&num[3].super_ScheduleStrategy);
      }
    }
    else {
      local_60._M_dataplus._M_p = (pointer)out;
      Potassco::operator<<((StringRef *)&local_60,(OffType *)&Potassco::off);
    }
    goto LAB_00122dbd;
  case 0x31:
    Potassco::string_cast<Clasp::ScheduleStrategy>(&local_60,&num[2].super_ScheduleStrategy);
    break;
  case 0x32:
    fVar1 = (float)num[4].super_ScheduleStrategy.idx;
    if ((fVar1 != 0.0) || (NAN(fVar1))) {
      local_68 = (char *)(1.0 / (double)fVar1);
      local_3c.val = num[5].super_ScheduleStrategy.idx - *(int *)&num[5].super_ScheduleStrategy;
      Potassco::toString<double,unsigned_int,unsigned_int>
                (&local_60,(Potassco *)&local_68,(double *)(num + 5),&local_3c.val,(uint *)in_R8);
    }
    else {
      Potassco::string_cast<Potassco::OffType>(&local_60,(OffType *)&Potassco::off);
    }
    break;
  case 0x33:
    local_68 = (char *)(CONCAT44(uVar11,*(uint *)&num[4].super_ScheduleStrategy >> 0x1d) &
                       0xffffffff00000003);
    Potassco::string_cast<unsigned_int>(&local_60,(uint *)&local_68);
    break;
  case 0x34:
    Potassco::toString<unsigned_int,unsigned_int>
              (&local_60,(Potassco *)&num[5].super_ScheduleStrategy.len,
               (uint *)&num[5].super_ScheduleStrategy.grow,&switchD_00121fd2::switchdataD_001a3328);
    break;
  case 0x35:
    uVar16 = *(uint *)&num[4].super_ScheduleStrategy >> 7;
    local_68 = (char *)(CONCAT44(uVar11,uVar16) & 0xffffffff0000000f);
    local_3c.val = *(uint *)&num[4].super_ScheduleStrategy >> 0x1f;
    Potassco::toString<unsigned_int,unsigned_int>
              (&local_60,(Potassco *)&local_68,&local_3c.val,(uint *)(ulong)(uVar16 & 0xf));
    break;
  case 0x36:
    local_68 = (char *)(CONCAT44(uVar11,*(uint *)&num[4].super_ScheduleStrategy >> 0x12) &
                       0xffffffff0000007f);
    Potassco::string_cast<unsigned_int>(&local_60,(uint *)&local_68);
    break;
  case 0x37:
    local_68 = (char *)CONCAT44(uVar11,(this->super_ClaspConfig).asp.erMode);
    Potassco::string_cast<Clasp::Asp::LogicProgram::ExtendedRuleMode>
              (&local_60,(ExtendedRuleMode *)&local_68);
    break;
  case 0x38:
    local_68 = (char *)(CONCAT44(uVar11,*(undefined4 *)&(this->super_ClaspConfig).asp.field_0x4) &
                       0xffffffff03ffffff);
    Potassco::string_cast<unsigned_int>(&local_60,(uint *)&local_68);
    break;
  case 0x39:
    local_68 = (char *)(CONCAT44(uVar11,*(uint *)&(this->super_ClaspConfig).asp.field_0x4 >> 0x1d) &
                       0xffffffff00000001);
    Potassco::string_cast<unsigned_int>(&local_60,(uint *)&local_68);
    break;
  case 0x3a:
    local_68 = (char *)(CONCAT44(uVar11,*(uint *)&(this->super_ClaspConfig).asp.field_0x4 >> 0x1b) &
                       0xffffffff00000001);
    Potassco::string_cast<unsigned_int>(&local_60,(uint *)&local_68);
    break;
  case 0x3b:
    local_68 = (char *)(CONCAT44(uVar11,*(uint *)&(this->super_ClaspConfig).asp.field_0x4 >> 0x1a) &
                       0xffffffff00000001);
    Potassco::string_cast<unsigned_int>(&local_60,(uint *)&local_68);
    break;
  case 0x3c:
    local_68 = (char *)CONCAT44(uVar11,*(uint *)&(this->super_ClaspConfig).asp.field_0x4 >> 0x1f);
    Potassco::string_cast<unsigned_int>(&local_60,(uint *)&local_68);
    break;
  case 0x3d:
    local_68 = (char *)(CONCAT44(uVar11,*(uint *)&(this->super_ClaspConfig).asp.field_0x4 >> 0x1c) &
                       0xffffffff00000001);
    Potassco::string_cast<unsigned_int>(&local_60,(uint *)&local_68);
    break;
  case 0x3e:
    local_68 = (char *)(CONCAT44(uVar11,*(uint *)&(this->super_ClaspConfig).asp.field_0x4 >> 0x1e) &
                       0xffffffff00000001);
    Potassco::string_cast<unsigned_int>(&local_60,(uint *)&local_68);
    break;
  case 0x3f:
    uVar14 = (this->super_ClaspConfig).solve.super_ParallelSolveOptions.super_BasicSolveOptions.
             limit.conflicts;
    if (0xfffffffe < uVar14) {
      uVar14 = 0xffffffff;
    }
    local_68 = (char *)CONCAT44(uVar11,(int)uVar14);
    puVar8 = (uint *)(this->super_ClaspConfig).solve.super_ParallelSolveOptions.
                     super_BasicSolveOptions.limit.restarts;
    y = (uint *)0xffffffff;
    if (puVar8 < (uint *)0xffffffff) {
      y = puVar8;
    }
    local_3c.val = (uint)y;
    Potassco::toString<unsigned_int,unsigned_int>(&local_60,(Potassco *)&local_68,&local_3c.val,y);
    break;
  case 0x40:
    local_68 = (char *)CONCAT44(uVar11,(this->super_ClaspConfig).solve.super_ParallelSolveOptions.
                                       algorithm.mode);
    Potassco::toString<unsigned_int,Clasp::mt::ParallelSolveOptions::Algorithm::SearchMode>
              (&local_60,
               (Potassco *)&(this->super_ClaspConfig).solve.super_ParallelSolveOptions.algorithm,
               (uint *)&local_68,&switchD_00121fd2::switchdataD_001a3328);
    break;
  case 0x41:
    if ((this->super_ClaspConfig).solve.super_ParallelSolveOptions.restarts.maxR == 0) {
      Potassco::string_cast<Potassco::OffType>(&local_60,(OffType *)&Potassco::off);
    }
    else {
      Potassco::toString<unsigned_int,Clasp::ScheduleStrategy>
                (&local_60,
                 (Potassco *)&(this->super_ClaspConfig).solve.super_ParallelSolveOptions.restarts,
                 (uint *)&(this->super_ClaspConfig).solve.super_ParallelSolveOptions.restarts.sched,
                 (ScheduleStrategy *)&switchD_00121fd2::switchdataD_001a3328);
    }
    break;
  case 0x42:
    PVar4 = (this->super_ClaspConfig).solve.super_ParallelSolveOptions.distribute.super_Policy;
    if ((uint)PVar4 < 0x20000000) {
      local_60._M_dataplus._M_p = (pointer)out;
      Potassco::operator<<((StringRef *)&local_60,(OffType *)&Potassco::off);
    }
    else {
      local_68 = (char *)CONCAT44(uVar11,(uint)PVar4 >> 0x1d);
      local_60._M_dataplus._M_p = (pointer)out;
      pSVar15 = Potassco::operator<<((StringRef *)&local_60,(Types *)&local_68);
      local_3c.val = (this->super_ClaspConfig).solve.super_ParallelSolveOptions.distribute.mode;
      pSVar15 = Potassco::operator<<(pSVar15,&local_3c.val);
      local_38 = (uint)(this->super_ClaspConfig).solve.super_ParallelSolveOptions.distribute.
                       super_Policy >> 0x16 & 0x7f;
      pSVar15 = Potassco::operator<<(pSVar15,&local_38);
      local_34 = (uint)(this->super_ClaspConfig).solve.super_ParallelSolveOptions.distribute.
                       super_Policy & 0x3fffff;
      Potassco::operator<<(pSVar15,&local_34);
    }
    goto LAB_00122dbd;
  case 0x43:
    IVar3 = (this->super_ClaspConfig).solve.super_ParallelSolveOptions.integrate;
    local_68 = (char *)(CONCAT44(uVar11,(uint)IVar3 >> 0x1c) & 0xffffffff00000003);
    local_3c.val = (uint)IVar3 & 0xfffffff;
    local_38 = (uint)IVar3 >> 0x1e;
    Potassco::
    toString<Clasp::mt::ParallelSolveOptions::Integration::Filter,unsigned_int,Clasp::mt::ParallelSolveOptions::Integration::Topology>
              (&local_60,(Potassco *)&local_68,&local_3c.val,&local_38,(Topology *)in_R8);
    break;
  case 0x44:
    Potassco::string_cast<Clasp::EnumOptions::EnumType>
              (&local_60,&(this->super_ClaspConfig).solve.super_EnumOptions.enumMode);
    break;
  case 0x45:
    uVar16 = (this->super_ClaspConfig).solve.super_EnumOptions.project;
    if (uVar16 == 0) {
      Potassco::string_cast<Potassco::OffType>(&local_60,(OffType *)&Potassco::off);
    }
    else {
      local_68 = (char *)CONCAT44(uVar11,uVar16 >> 1);
      Potassco::toString<Clasp::ProjectMode_t::Mode,unsigned_int>
                (&local_60,(Potassco *)&(this->super_ClaspConfig).solve.super_EnumOptions.proMode,
                 (Mode *)&local_68,&switchD_00121fd2::switchdataD_001a3328);
    }
    break;
  case 0x46:
    Potassco::string_cast<long>
              (&local_60,&(this->super_ClaspConfig).solve.super_EnumOptions.numModels);
    break;
  case 0x47:
    local_60._M_dataplus._M_p = (pointer)out;
    Potassco::operator<<
              ((StringRef *)&local_60,&(this->super_ClaspConfig).solve.super_EnumOptions.optMode);
    if ((this->super_ClaspConfig).solve.super_EnumOptions.optBound.ebo_.size != 0) {
      Potassco::operator<<
                ((StringRef *)&local_60,&(this->super_ClaspConfig).solve.super_EnumOptions.optBound)
      ;
    }
    goto LAB_00122dbd;
  case 0x48:
    if ((this->super_ClaspConfig).solve.super_EnumOptions.optStop.ebo_.size == 0) {
      local_60._M_dataplus._M_p = (pointer)out;
      Potassco::operator<<((StringRef *)&local_60,(OffType *)&Potassco::off);
    }
    else {
      local_60._M_dataplus._M_p = (pointer)out;
      Potassco::operator<<
                ((StringRef *)&local_60,&(this->super_ClaspConfig).solve.super_EnumOptions.optStop);
    }
    goto LAB_00122dbd;
  default:
    Potassco::fail(-1,"int Clasp::Cli::ClaspCliConfig::getValue(KeyType, std::string &) const",0x3b2
                   ,"false","invalid option",0);
  }
  std::__cxx11::string::operator=((string *)out,(string *)&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
LAB_00122dbd:
  return (int)out->_M_string_length;
}

Assistant:

int ClaspCliConfig::getValue(KeyType key, std::string& out) const {
	try {
		const UserConfig* base = active(this, decodeMode(key));
		int16 o = decodeKey(key);
		int   r = isLeafId(o) && base ? 1 : -1;
		if (r > 0 && isOption(o)) {
			POTASSCO_ASSERT(base == this || isTesterOption(o));
			uint32 sId = decodeSolver(key);
			const SolverParams* solver = &base->solver(sId);
			const SolveParams*  search = &base->search(sId);
			// helper macros used in get
			using Potassco::toString; using Potassco::off; using Potassco::Set;
			#define GET_FUN(x)     Potassco::StringRef x(out); if (!x.out);else
			#define GET(...)       out = toString( __VA_ARGS__ )
			#define GET_IF(c, ...) out = ITE((c), toString(__VA_ARGS__), toString(off))
			switch(static_cast<OptionKey>(o)) {
				default: POTASSCO_ASSERT(false, "invalid option");
				#define OPTION(k, e, a, h, _, GET) case opt_##k: { GET ; } break;
				#define CLASP_ALL_GROUPS
				#include <clasp/cli/clasp_cli_options.inl>
			}
			#undef GET_FUN
			#undef GET
			#undef GET_IF
		}
		else if (r > 0 && o == meta_config) {
			if (base->cliConfig < config_max_value) { xconvert(out, static_cast<ConfigKey>(base->cliConfig)); }
			else                                    { out.append(config_[base == testerConfig()]); }
		}
		return r > 0 ? static_cast<int>(out.length()) : r;
	}
	catch (...) { return -2; }
}